

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O3

void __thiscall KDReports::Test::testSeparateHeaderAndFooter(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QStandardItem *pQVar6;
  AutoTableElement *pAVar7;
  QObject *pQVar8;
  char *pcVar9;
  char *pcVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QStandardItemModel model;
  QArrayDataPointer<char16_t> local_b8;
  Report report;
  AutoTableElement autoTable;
  QChar *pQStack_80;
  qsizetype local_78;
  QFile footerFile;
  QFile file;
  QStringView local_40;
  char *local_30;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  local_b8.d = (Data *)0x1116d7;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_e8,(char **)&local_b8)
  ;
  QVar11.m_data = (storage_type *)local_e8.d;
  QVar11.m_size = (qsizetype)&autoTable;
  QString::fromUtf8(QVar11);
  local_108.d = _autoTable;
  _autoTable = (Data *)0x0;
  local_108.ptr = &pQStack_80->ucs;
  local_108.size = local_78;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
  QFile::QFile(&file,(QString *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  bVar3 = (bool)QFile::open(&file,1);
  cVar4 = QTest::qVerify(bVar3,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x15c);
  if (cVar4 != '\0') {
    bVar3 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar4 = QTest::qVerify(bVar3,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x15d);
    if (cVar4 != '\0') {
      QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
      pQVar6 = (QStandardItem *)operator_new(0x10);
      local_b8.d = (Data *)0x11161f;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)&local_e8,(char **)&local_b8);
      QVar12.m_data = (storage_type *)local_e8.d;
      QVar12.m_size = (qsizetype)&autoTable;
      QString::fromUtf8(QVar12);
      local_108.d = _autoTable;
      _autoTable = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_108.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
      QStandardItem::QStandardItem(pQVar6,(QString *)&local_108);
      QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      pQVar6 = (QStandardItem *)operator_new(0x10);
      local_b8.d = (Data *)0x111625;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)&local_e8,(char **)&local_b8);
      QVar13.m_data = (storage_type *)local_e8.d;
      QVar13.m_size = (qsizetype)&autoTable;
      QString::fromUtf8(QVar13);
      local_108.d = _autoTable;
      _autoTable = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_108.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
      QStandardItem::QStandardItem(pQVar6,(QString *)&local_108);
      QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      KDReports::AutoTableElement::AutoTableElement(&autoTable,(QAbstractItemModel *)&model);
      pAVar7 = (AutoTableElement *)KDReports::Report::mainTable();
      KDReports::MainTable::setAutoTableElement(pAVar7);
      local_40.m_size = 0x1116e8;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)&local_b8,(char **)&local_40);
      QVar14.m_data = (storage_type *)local_b8.d;
      QVar14.m_size = (qsizetype)&local_108;
      QString::fromUtf8(QVar14);
      local_e8.ptr = local_108.ptr;
      local_e8.d = local_108.d;
      local_108.d = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_e8.size = local_108.size;
      local_108.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QFile::QFile(&footerFile,(QString *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      bVar3 = (bool)QFile::open(&footerFile,1);
      cVar4 = QTest::qVerify(bVar3,"footerFile.open(QIODevice::ReadOnly)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x166);
      if (cVar4 != '\0') {
        bVar3 = (bool)KDReports::Report::loadFromXML
                                ((QIODevice *)&report,(ErrorDetails *)&footerFile);
        cVar4 = QTest::qVerify(bVar3,"report.loadFromXML(&footerFile)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x167);
        if (cVar4 != '\0') {
          iVar5 = KDReports::Report::header(&report,6);
          KDReports::Header::preparePaintingPage(iVar5);
          KDReports::Header::doc();
          KDReports::TextDocument::contentDocument();
          QTextDocument::toPlainText();
          local_30 = "Page 1 of 1";
          QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_40,&local_30);
          QVar15.m_data = (storage_type *)local_40.m_size;
          QVar15.m_size = (qsizetype)&local_108;
          QString::fromUtf8(QVar15);
          local_b8.ptr = local_108.ptr;
          local_b8.d = local_108.d;
          local_108.d = (Data *)0x0;
          local_108.ptr = (char16_t *)0x0;
          local_b8.size = local_108.size;
          local_108.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)&local_108,(QChar *)local_e8.ptr,local_e8.size);
          QStringView::QStringView<QChar,_true>(&local_40,(QChar *)local_b8.ptr,local_b8.size);
          QVar1.m_data = local_108.ptr;
          QVar1.m_size = (qsizetype)local_108.d;
          QVar2.m_data = local_40.m_data;
          QVar2.m_size = local_40.m_size;
          cVar4 = QTest::qCompare(QVar1,QVar2,"header.doc().contentDocument().toPlainText()",
                                  "QString(\"Page 1 of 1\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x16e);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
          if (cVar4 != '\0') {
            KDReports::Report::mainTable();
            KDReports::MainTable::autoTableElement();
            pQVar8 = (QObject *)KDReports::AutoTableElement::tableModel();
            pcVar9 = (char *)QTest::toString(pQVar8);
            pcVar10 = (char *)QTest::toString((QObject *)&model);
            cVar4 = QTest::compare_helper
                              (pQVar8 == (QObject *)&model,
                               "Compared QObject pointers are not the same",pcVar9,pcVar10,
                               "report.mainTable()->autoTableElement()->tableModel()","baseModel",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x170);
            if (cVar4 != '\0') {
              KDReports::Report::footer(&report,6);
              KDReports::Header::doc();
              KDReports::TextDocument::contentDocument();
              QTextDocument::toPlainText();
              QString::QString((QString *)&local_e8,"footer");
              QTest::qCompare((QString *)&local_108,(QString *)&local_e8,
                              "footer.doc().contentDocument().toPlainText()","QString(\"footer\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x172);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
            }
          }
        }
      }
      QFile::~QFile(&footerFile);
      KDReports::AutoTableElement::~AutoTableElement(&autoTable);
      QStandardItemModel::~QStandardItemModel(&model);
    }
  }
  QFile::~QFile(&file);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSeparateHeaderAndFooter()
    {
        Report report;
        report.setReportMode(Report::SpreadSheet);

        QFile file(":/doc_header.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        AutoTableElement autoTable(&model);
        report.mainTable()->setAutoTableElement(autoTable);

        QFile footerFile(":/doc_footer.xml");
        QVERIFY(footerFile.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&footerFile));

        // report.exportToFile( "testSeparateHeaderAndFooter.pdf" ); // for debugging

        // Check that we have header, table, and footer
        Header &header = report.header();
        header.preparePaintingPage(0);
        QCOMPARE(header.doc().contentDocument().toPlainText(), QString("Page 1 of 1"));
        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        Footer &footer = report.footer();
        QCOMPARE(footer.doc().contentDocument().toPlainText(), QString("footer"));
    }